

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCallbacks.cpp
# Opt level: O0

void helicsCoreSetLoggingCallback
               (HelicsCore core,_func_void_int_char_ptr_char_ptr_void_ptr *logger,void *userdata,
               HelicsError *err)

{
  Core *pCVar1;
  long in_RSI;
  Core *coreObj;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff50;
  HelicsCore in_stack_ffffffffffffff58;
  anon_class_16_2_121d9f3e *__f;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffff60;
  anon_class_16_2_121d9f3e local_80 [2];
  uint local_60;
  undefined1 local_50 [36];
  uint local_2c;
  Core *local_28;
  long local_10;
  
  local_10 = in_RSI;
  pCVar1 = getCore(in_stack_ffffffffffffff58,(HelicsError *)in_stack_ffffffffffffff50);
  if (pCVar1 != (Core *)0x0) {
    local_28 = pCVar1;
    if (local_10 == 0) {
      local_2c = 0xfffffefd;
      std::
      function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::function(in_stack_ffffffffffffff50);
      (*pCVar1->_vptr_Core[0x57])(pCVar1,(ulong)local_2c,local_50);
      std::
      function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                   *)0x1f0a2f);
    }
    else {
      local_60 = 0xfffffefd;
      __f = local_80;
      std::
      function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
      ::function<helicsCoreSetLoggingCallback::__0,void>(in_stack_ffffffffffffff60,__f);
      (*pCVar1->_vptr_Core[0x57])(pCVar1,(ulong)local_60,__f);
      std::
      function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                   *)0x1f0aba);
    }
  }
  return;
}

Assistant:

void helicsCoreSetLoggingCallback(HelicsCore core,
                                  void (*logger)(int loglevel, const char* identifier, const char* message, void* userdata),
                                  void* userdata,
                                  HelicsError* err)
{
    auto* coreObj = getCore(core, err);
    if (coreObj == nullptr) {
        return;
    }
    try {
        if (logger == nullptr) {
            coreObj->setLoggingCallback(helics::gLocalCoreId, {});
        } else {
            coreObj->setLoggingCallback(helics::gLocalCoreId,
                                        [logger, userdata](int loglevel, std::string_view ident, std::string_view message) {
                                            const std::string identifier(ident);
                                            const std::string mess(message);
                                            logger(loglevel, identifier.c_str(), mess.c_str(), userdata);
                                        });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}